

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O3

uint32_t ucptrie_get_63(UCPTrie *trie,UChar32 c)

{
  char cVar1;
  void *pvVar2;
  uint uVar3;
  
  if (0x7f < (uint)c) {
    uVar3 = 0xfff;
    if (trie->type == '\0') {
      uVar3 = 0xffff;
    }
    if (uVar3 < (uint)c) {
      if ((uint)c < 0x110000) {
        if (c < trie->highStart) {
          c = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          c = trie->dataLength + -2;
        }
      }
      else {
        c = trie->dataLength + -1;
      }
    }
    else {
      c = (c & 0x3fU) + (uint)trie->index[(uint)c >> 6];
    }
  }
  pvVar2 = (trie->data).ptr0;
  cVar1 = trie->valueWidth;
  if (cVar1 == '\x02') {
    uVar3 = (uint)*(byte *)((long)pvVar2 + (long)c);
  }
  else if (cVar1 == '\x01') {
    uVar3 = *(uint *)((long)pvVar2 + (long)c * 4);
  }
  else {
    uVar3 = 0xffffffff;
    if (cVar1 == '\0') {
      uVar3 = (uint)*(ushort *)((long)pvVar2 + (long)c * 2);
    }
  }
  return uVar3;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
ucptrie_get(const UCPTrie *trie, UChar32 c) {
    int32_t dataIndex;
    if ((uint32_t)c <= 0x7f) {
        // linear ASCII
        dataIndex = c;
    } else {
        UChar32 fastMax = trie->type == UCPTRIE_TYPE_FAST ? 0xffff : UCPTRIE_SMALL_MAX;
        dataIndex = _UCPTRIE_CP_INDEX(trie, fastMax, c);
    }
    return getValue(trie->data, (UCPTrieValueWidth)trie->valueWidth, dataIndex);
}